

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenVertexNormalsProcess.cpp
# Opt level: O2

bool __thiscall
Assimp::GenVertexNormalsProcess::GenMeshVertexNormals
          (GenVertexNormalsProcess *this,aiMesh *pMesh,uint meshIndex)

{
  aiFace *paVar1;
  uint uVar2;
  aiVector3D *paVar3;
  uint *puVar4;
  SharedPostProcessInfo *this_00;
  pointer ppVar5;
  uint i_1;
  aiVector3D *paVar6;
  aiVector3t<float> *paVar7;
  Logger *this_01;
  uint i;
  ulong uVar8;
  uint i_2;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  pointer this_02;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  aiVector3t<float> aVar16;
  reference rVar17;
  ai_real local_bc;
  aiVector3t<float> local_b8;
  allocator_type local_a9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> verticesFound;
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  *avf;
  float local_78;
  SpatialSort _vertexFinder;
  
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    if (this->force_ != true) {
      return false;
    }
    operator_delete__(pMesh->mNormals);
  }
  if ((pMesh->mPrimitiveTypes & 0xc) == 0) {
    this_01 = DefaultLogger::get();
    Logger::info(this_01,"Normal vectors are undefined for line and point meshes");
    return false;
  }
  uVar9 = pMesh->mNumVertices;
  uVar11 = (ulong)uVar9 * 0xc;
  paVar6 = (aiVector3D *)operator_new__(uVar11);
  if ((ulong)uVar9 != 0) {
    uVar11 = uVar11 - 0xc;
    memset(paVar6,0,(uVar11 - uVar11 % 0xc) + 0xc);
  }
  pMesh->mNormals = paVar6;
  for (uVar11 = 0; uVar11 < pMesh->mNumFaces; uVar11 = uVar11 + 1) {
    paVar1 = pMesh->mFaces + uVar11;
    uVar9 = pMesh->mFaces[uVar11].mNumIndices;
    if (uVar9 < 3) {
      for (uVar8 = 0; uVar8 < uVar9; uVar8 = uVar8 + 1) {
        paVar3 = pMesh->mNormals;
        uVar9 = paVar1->mIndices[uVar8];
        paVar6 = paVar3 + uVar9;
        paVar6->x = NAN;
        paVar6->y = NAN;
        paVar3[uVar9].z = NAN;
        uVar9 = paVar1->mNumIndices;
      }
    }
    else {
      paVar6 = pMesh->mVertices;
      puVar4 = paVar1->mIndices;
      uVar2 = *puVar4;
      uVar9 = puVar4[uVar9 - 1];
      aVar16 = operator-(paVar6 + puVar4[1],paVar6 + uVar2);
      verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = aVar16._0_8_;
      verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(verticesFound.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish._4_4_,aVar16.z);
      aVar16 = operator-(paVar6 + uVar9,paVar6 + uVar2);
      local_b8.z = aVar16.z;
      local_b8._0_8_ = aVar16._0_8_;
      aVar16 = operator^((aiVector3t<float> *)&verticesFound,&local_b8);
      local_78 = aVar16.z;
      avf = aVar16._0_8_;
      paVar7 = aiVector3t<float>::NormalizeSafe((aiVector3t<float> *)&avf);
      _vertexFinder.mPlaneNormal.x = paVar7->x;
      _vertexFinder.mPlaneNormal.y = paVar7->y;
      _vertexFinder.mPlaneNormal.z = paVar7->z;
      for (uVar8 = 0; uVar8 < paVar1->mNumIndices; uVar8 = uVar8 + 1) {
        paVar6 = pMesh->mNormals;
        uVar9 = paVar1->mIndices[uVar8];
        paVar6[uVar9].z = _vertexFinder.mPlaneNormal.z;
        paVar6 = paVar6 + uVar9;
        paVar6->x = _vertexFinder.mPlaneNormal.x;
        paVar6->y = _vertexFinder.mPlaneNormal.y;
      }
    }
  }
  SpatialSort::SpatialSort(&_vertexFinder);
  this_00 = (this->super_BaseProcess).shared;
  if ((this_00 == (SharedPostProcessInfo *)0x0) ||
     (SharedPostProcessInfo::
      GetProperty<std::vector<std::pair<Assimp::SpatialSort,float>,std::allocator<std::pair<Assimp::SpatialSort,float>>>>
                (this_00,"$Spat",&avf),
     avf == (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
             *)0x0)) {
    this_02 = (pointer)&_vertexFinder;
    SpatialSort::Fill((SpatialSort *)this_02,pMesh->mVertices,pMesh->mNumVertices,0xc,true);
    local_bc = ComputePositionEpsilon(pMesh);
  }
  else {
    ppVar5 = (avf->
             super__Vector_base<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    this_02 = ppVar5 + meshIndex;
    local_bc = ppVar5[meshIndex].second;
  }
  verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar11 = (ulong)pMesh->mNumVertices;
  paVar6 = (aiVector3D *)operator_new__(uVar11 * 0xc);
  if (uVar11 != 0) {
    uVar8 = uVar11 * 0xc - 0xc;
    memset(paVar6,0,(uVar8 - uVar8 % 0xc) + 0xc);
  }
  if (3.054326 <= this->configMaxAngle) {
    local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&avf,uVar11,(bool *)&local_b8,&local_a9);
    for (uVar11 = 0; uVar11 < pMesh->mNumVertices; uVar11 = uVar11 + 1) {
      rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&avf,uVar11);
      if ((*rVar17._M_p & rVar17._M_mask) == 0) {
        SpatialSort::FindPositions
                  (&this_02->first,pMesh->mVertices + uVar11,local_bc,&verticesFound);
        local_b8.x = 0.0;
        local_b8.y = 0.0;
        local_b8.z = 0.0;
        fVar12 = 0.0;
        fVar13 = 0.0;
        fVar14 = 0.0;
        for (uVar9 = 0;
            (ulong)uVar9 <
            (ulong)((long)verticesFound.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)verticesFound.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2); uVar9 = uVar9 + 1) {
          paVar3 = pMesh->mNormals;
          uVar2 = verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar9];
          fVar15 = paVar3[uVar2].x;
          if ((~(uint)fVar15 & 0x7f800000) != 0 || ((uint)fVar15 & 0x7fffff) == 0) {
            fVar14 = fVar14 + fVar15;
            fVar13 = fVar13 + paVar3[uVar2].y;
            local_b8.y = fVar13;
            local_b8.x = fVar14;
            fVar12 = fVar12 + paVar3[uVar2].z;
            local_b8.z = fVar12;
          }
        }
        aiVector3t<float>::NormalizeSafe(&local_b8);
        for (uVar9 = 0;
            (ulong)uVar9 <
            (ulong)((long)verticesFound.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)verticesFound.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2); uVar9 = uVar9 + 1) {
          uVar8 = (ulong)verticesFound.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar9];
          paVar6[uVar8].z = local_b8.z;
          paVar6[uVar8].x = local_b8.x;
          paVar6[uVar8].y = local_b8.y;
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&avf,uVar8);
          *rVar17._M_p = *rVar17._M_p | rVar17._M_mask;
        }
      }
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&avf);
  }
  else {
    fVar12 = cosf(this->configMaxAngle);
    for (uVar11 = 0; uVar11 < pMesh->mNumVertices; uVar11 = uVar11 + 1) {
      SpatialSort::FindPositions(&this_02->first,pMesh->mVertices + uVar11,local_bc,&verticesFound);
      paVar3 = pMesh->mNormals;
      avf = (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
             *)0x0;
      local_78 = 0.0;
      fVar13 = 0.0;
      fVar14 = 0.0;
      fVar15 = 0.0;
      for (uVar9 = 0;
          (ulong)uVar9 <
          (ulong)((long)verticesFound.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)verticesFound.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2); uVar9 = uVar9 + 1) {
        uVar10 = (ulong)verticesFound.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar9];
        uVar8._0_4_ = paVar3[uVar10].x;
        uVar8._4_4_ = paVar3[uVar10].y;
        if ((~(undefined4)uVar8 & 0x7f800000) != 0 || (uVar8 & 0x7fffff) == 0) {
          if ((uVar11 == uVar10) ||
             (fVar12 <= paVar3[uVar10].z * paVar3[uVar11].z +
                        (float)(undefined4)uVar8 * paVar3[uVar11].x +
                        (float)uVar8._4_4_ * paVar3[uVar11].y)) {
            fVar13 = fVar13 + (float)(undefined4)uVar8;
            fVar14 = fVar14 + (float)uVar8._4_4_;
            avf = (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                   *)CONCAT44(fVar14,fVar13);
            fVar15 = fVar15 + paVar3[uVar10].z;
            local_78 = fVar15;
          }
        }
      }
      paVar7 = aiVector3t<float>::NormalizeSafe((aiVector3t<float> *)&avf);
      paVar6[uVar11].z = paVar7->z;
      fVar13 = paVar7->y;
      paVar6[uVar11].x = paVar7->x;
      paVar6[uVar11].y = fVar13;
    }
  }
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    operator_delete__(pMesh->mNormals);
  }
  pMesh->mNormals = paVar6;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  SpatialSort::~SpatialSort(&_vertexFinder);
  return true;
}

Assistant:

bool GenVertexNormalsProcess::GenMeshVertexNormals (aiMesh* pMesh, unsigned int meshIndex)
{
    if (NULL != pMesh->mNormals) {
        if (force_) delete[] pMesh->mNormals;
        else return false;
    }

    // If the mesh consists of lines and/or points but not of
    // triangles or higher-order polygons the normal vectors
    // are undefined.
    if (!(pMesh->mPrimitiveTypes & (aiPrimitiveType_TRIANGLE | aiPrimitiveType_POLYGON)))
    {
        ASSIMP_LOG_INFO("Normal vectors are undefined for line and point meshes");
        return false;
    }

    // Allocate the array to hold the output normals
    const float qnan = std::numeric_limits<ai_real>::quiet_NaN();
    pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];

    // Compute per-face normals but store them per-vertex
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        const aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices < 3)
        {
            // either a point or a line -> no normal vector
            for (unsigned int i = 0;i < face.mNumIndices;++i) {
                pMesh->mNormals[face.mIndices[i]] = aiVector3D(qnan);
            }

            continue;
        }

        const aiVector3D* pV1 = &pMesh->mVertices[face.mIndices[0]];
        const aiVector3D* pV2 = &pMesh->mVertices[face.mIndices[1]];
        const aiVector3D* pV3 = &pMesh->mVertices[face.mIndices[face.mNumIndices-1]];
        const aiVector3D vNor = ((*pV2 - *pV1) ^ (*pV3 - *pV1)).NormalizeSafe();

        for (unsigned int i = 0;i < face.mNumIndices;++i) {
            pMesh->mNormals[face.mIndices[i]] = vNor;
        }
    }

    // Set up a SpatialSort to quickly find all vertices close to a given position
    // check whether we can reuse the SpatialSort of a previous step.
    SpatialSort* vertexFinder = NULL;
    SpatialSort  _vertexFinder;
    ai_real posEpsilon = ai_real( 1e-5 );
    if (shared) {
        std::vector<std::pair<SpatialSort,ai_real> >* avf;
        shared->GetProperty(AI_SPP_SPATIAL_SORT,avf);
        if (avf)
        {
            std::pair<SpatialSort,ai_real>& blubb = avf->operator [] (meshIndex);
            vertexFinder = &blubb.first;
            posEpsilon = blubb.second;
        }
    }
    if (!vertexFinder)  {
        _vertexFinder.Fill(pMesh->mVertices, pMesh->mNumVertices, sizeof( aiVector3D));
        vertexFinder = &_vertexFinder;
        posEpsilon = ComputePositionEpsilon(pMesh);
    }
    std::vector<unsigned int> verticesFound;
    aiVector3D* pcNew = new aiVector3D[pMesh->mNumVertices];

    if (configMaxAngle >= AI_DEG_TO_RAD( 175.f ))   {
        // There is no angle limit. Thus all vertices with positions close
        // to each other will receive the same vertex normal. This allows us
        // to optimize the whole algorithm a little bit ...
        std::vector<bool> abHad(pMesh->mNumVertices,false);
        for (unsigned int i = 0; i < pMesh->mNumVertices;++i)   {
            if (abHad[i]) {
                continue;
            }

            // Get all vertices that share this one ...
            vertexFinder->FindPositions( pMesh->mVertices[i], posEpsilon, verticesFound);

            aiVector3D pcNor;
            for (unsigned int a = 0; a < verticesFound.size(); ++a) {
                const aiVector3D& v = pMesh->mNormals[verticesFound[a]];
                if (is_not_qnan(v.x))pcNor += v;
            }
            pcNor.NormalizeSafe();

            // Write the smoothed normal back to all affected normals
            for (unsigned int a = 0; a < verticesFound.size(); ++a)
            {
                unsigned int vidx = verticesFound[a];
                pcNew[vidx] = pcNor;
                abHad[vidx] = true;
            }
        }
    }
    // Slower code path if a smooth angle is set. There are many ways to achieve
    // the effect, this one is the most straightforward one.
    else    {
        const ai_real fLimit = std::cos(configMaxAngle);
        for (unsigned int i = 0; i < pMesh->mNumVertices;++i)   {
            // Get all vertices that share this one ...
            vertexFinder->FindPositions( pMesh->mVertices[i] , posEpsilon, verticesFound);

            aiVector3D vr = pMesh->mNormals[i];

            aiVector3D pcNor;
            for (unsigned int a = 0; a < verticesFound.size(); ++a) {
                aiVector3D v = pMesh->mNormals[verticesFound[a]];

                // Check whether the angle between the two normals is not too large.
                // Skip the angle check on our own normal to avoid false negatives
                // (v*v is not guaranteed to be 1.0 for all unit vectors v)
                if (is_not_qnan(v.x) && (verticesFound[a] == i || (v * vr >= fLimit)))
                    pcNor += v;
            }
            pcNew[i] = pcNor.NormalizeSafe();
        }
    }

    delete[] pMesh->mNormals;
    pMesh->mNormals = pcNew;

    return true;
}